

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBar::changeEvent(QTabBar *this,QEvent *event)

{
  QTabBarPrivate *this_00;
  ushort uVar1;
  TextElideMode TVar2;
  int iVar3;
  QStyle *pQVar4;
  
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (*(short *)(event + 8) != 0x61) {
    if (*(short *)(event + 8) != 100) goto LAB_0048f7cc;
    uVar1 = *(ushort *)&this_00->field_0x2d0;
    if ((uVar1 & 4) == 0) {
      pQVar4 = QWidget::style(&this->super_QWidget);
      TVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x43,0,this,0);
      this_00->elideMode = TVar2;
      uVar1 = *(ushort *)&this_00->field_0x2d0;
    }
    if ((uVar1 & 0x10) == 0) {
      pQVar4 = QWidget::style(&this->super_QWidget);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x26,0,this,0);
      *(ushort *)&this_00->field_0x2d0 =
           ((ushort)*(undefined4 *)&this_00->field_0x2d0 & 0xfff7) + (ushort)(iVar3 == 0) * 8;
    }
  }
  QHash<QString,_QSize>::clear(&this_00->textSizes);
  QTabBarPrivate::refresh(this_00);
LAB_0048f7cc:
  QWidget::changeEvent(&this->super_QWidget,event);
  return;
}

Assistant:

void QTabBar::changeEvent(QEvent *event)
{
    Q_D(QTabBar);
    switch (event->type()) {
    case QEvent::StyleChange:
        if (!d->elideModeSetByUser)
            d->elideMode = Qt::TextElideMode(style()->styleHint(QStyle::SH_TabBar_ElideMode, nullptr, this));
        if (!d->useScrollButtonsSetByUser)
            d->useScrollButtons = !style()->styleHint(QStyle::SH_TabBar_PreferNoArrows, nullptr, this);
        Q_FALLTHROUGH();
    case QEvent::FontChange:
        d->textSizes.clear();
        d->refresh();
        break;
    default:
        break;
    }

    QWidget::changeEvent(event);
}